

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

void __thiscall
apngasm::APNGAsm::write_chunk(APNGAsm *this,FILE *f,char *name,uchar *data,uint length)

{
  undefined4 uVar1;
  uchar buf [4];
  
  uVar1 = crc32(0,0,0);
  png_save_uint_32(buf,length);
  fwrite(buf,1,4,(FILE *)f);
  fwrite(name,1,4,(FILE *)f);
  uVar1 = crc32(uVar1,name,4);
  if (*(int *)name == 0x54416466) {
    this->_next_seq_num = this->_next_seq_num + 1;
    png_save_uint_32(buf);
    fwrite(buf,1,4,(FILE *)f);
    uVar1 = crc32(uVar1,buf,4);
    length = length - 4;
  }
  if (length != 0 && data != (uchar *)0x0) {
    fwrite(data,1,(ulong)length,(FILE *)f);
    uVar1 = crc32(uVar1,data,length);
  }
  png_save_uint_32(buf,uVar1);
  fwrite(buf,1,4,(FILE *)f);
  return;
}

Assistant:

void APNGAsm::write_chunk(FILE * f, const char * name, unsigned char * data, unsigned int length)
  {
    unsigned char buf[4];
    unsigned int crc = crc32(0, Z_NULL, 0);

    png_save_uint_32(buf, length);
    fwrite(buf, 1, 4, f);
    fwrite(name, 1, 4, f);
    crc = crc32(crc, (const Bytef *)name, 4);

    if (memcmp(name, "fdAT", 4) == 0)
    {
      png_save_uint_32(buf, _next_seq_num++);
      fwrite(buf, 1, 4, f);
      crc = crc32(crc, buf, 4);
      length -= 4;
    }

    if (data != NULL && length > 0)
    {
      fwrite(data, 1, length, f);
      crc = crc32(crc, data, length);
    }

    png_save_uint_32(buf, crc);
    fwrite(buf, 1, 4, f);
  }